

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltm.c
# Opt level: O0

TValue * luaT_gettmbyobj(lua_State *L,TValue *o,TMS event)

{
  TString *key;
  Node *n_00;
  TKey *pTVar1;
  TValue *local_68;
  Table *local_58;
  Table *mt;
  TMS event_local;
  TValue *o_local;
  lua_State *L_local;
  int nx;
  TValue *k;
  Node *n;
  TValue *local_10;
  
  switch(o->tt_ & 0x7f) {
  case 5:
    if (o->tt_ != 0x8005) {
      __assert_fail("((((o))->tt_) == (((5) | (1 << 15))))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltm.c"
                    ,0x4e,"const TValue *luaT_gettmbyobj(lua_State *, const TValue *, TMS)");
    }
    if (((o->value_).gc)->tt != '\x05') {
      __assert_fail("(((o)->value_).gc)->tt == 5",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltm.c"
                    ,0x4e,"const TValue *luaT_gettmbyobj(lua_State *, const TValue *, TMS)");
    }
    local_58 = *(Table **)((o->value_).f + 0x28);
    break;
  default:
    local_58 = L->l_G->mt[(int)(o->tt_ & 0xf)];
    break;
  case 7:
    if (o->tt_ != 0x8007) {
      __assert_fail("((((o))->tt_) == (((7) | (1 << 15))))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltm.c"
                    ,0x51,"const TValue *luaT_gettmbyobj(lua_State *, const TValue *, TMS)");
    }
    if (((o->value_).gc)->tt != '\a') {
      __assert_fail("(((o)->value_).gc)->tt == 7",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltm.c"
                    ,0x51,"const TValue *luaT_gettmbyobj(lua_State *, const TValue *, TMS)");
    }
    local_58 = *(Table **)((o->value_).f + 0x10);
    break;
  case 0x15:
  case 0x25:
    if ((o->tt_ != 0x8015) && (o->tt_ != 0x8025)) {
      __assert_fail("(((((o))->tt_) == (((((5) | ((1) << 4))) | (1 << 15)))) || ((((o))->tt_) == (((((5) | ((2) << 4))) | (1 << 15)))))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltm.c"
                    ,0x4b,"const TValue *luaT_gettmbyobj(lua_State *, const TValue *, TMS)");
    }
    if ((((o->value_).gc)->tt != '\x15') && (((o->value_).gc)->tt != '%')) {
      __assert_fail("((((o)->value_).gc)->tt == ((5) | ((1) << 4)) || (((o)->value_).gc)->tt == ((5) | ((2) << 4)))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltm.c"
                    ,0x4b,"const TValue *luaT_gettmbyobj(lua_State *, const TValue *, TMS)");
    }
    local_58 = *(Table **)((o->value_).f + 0x38);
  }
  if (local_58 == (Table *)0x0) {
    local_68 = &luaO_nilobject_;
    return local_68;
  }
  key = L->l_G->tmname[event];
  n_00 = local_58->node + (key->hash & local_58->hmask);
  if (key->tt != '\x04') {
    __assert_fail("key->tt == ((4) | ((0) << 4))",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h"
                  ,0x5a,"const TValue *luaH_getshortstr(Table *, TString *)");
  }
  pTVar1 = &n_00->i_key;
  if ((n_00->i_key).nk.tt_ == 0x8004) {
    if (((n_00->i_key).nk.tt_ & 0xf) != 4) {
      __assert_fail("(((((((k))->tt_)) & 0x0F)) == (4))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h"
                    ,0x5c,"const TValue *luaH_getshortstr(Table *, TString *)");
    }
    if ((((pTVar1->nk).value_.gc)->tt & 0xf) != 4) {
      __assert_fail("(((((k)->value_).gc)->tt) & 0x0F) == 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h"
                    ,0x5c,"const TValue *luaH_getshortstr(Table *, TString *)");
    }
    if (((pTVar1->nk).value_.gc)->tt != '\x04') {
      __assert_fail("((((void) sizeof (((((((((k))->tt_)) & 0x0F)) == (4))) ? 1 : 0), __extension__ ({ if ((((((((k))->tt_)) & 0x0F)) == (4))) ; else __assert_fail (\"(((((((k))->tt_)) & 0x0F)) == (4))\", \"/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h\", 92, __extension__ __PRETTY_FUNCTION__); })), ((((void) sizeof (((((((k)->value_).gc)->tt) & 0x0F) == 4) ? 1 : 0), __extension__ ({ if ((((((k)->value_).gc)->tt) & 0x0F) == 4) ; else __assert_fail (\"(((((k)->value_).gc)->tt) & 0x0F) == 4\", \"/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h\", 92, __extension__ __PRETTY_FUNCTION__); })), (&((((union GCUnion *)((((k)->value_).gc))))->ts))))))->tt == ((4) | ((0) << 4))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h"
                    ,0x5c,"const TValue *luaH_getshortstr(Table *, TString *)");
    }
    if (((n_00->i_key).nk.tt_ & 0xf) != 4) {
      __assert_fail("(((((((k))->tt_)) & 0x0F)) == (4))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h"
                    ,0x5c,"const TValue *luaH_getshortstr(Table *, TString *)");
    }
    if ((((pTVar1->nk).value_.gc)->tt & 0xf) != 4) {
      __assert_fail("(((((k)->value_).gc)->tt) & 0x0F) == 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h"
                    ,0x5c,"const TValue *luaH_getshortstr(Table *, TString *)");
    }
    if ((TString *)(pTVar1->nk).value_.gc == key) {
      return &n_00->i_val;
    }
  }
  if ((n_00->i_key).nk.next == 0) {
    local_10 = &luaO_nilobject_;
  }
  else {
    local_10 = luaH_getshortstr_continue(key,n_00);
  }
  return local_10;
}

Assistant:

const TValue *luaT_gettmbyobj (lua_State *L, const TValue *o, TMS event) {
  Table *mt;
  switch (ttype(o)) {
    case RAVI_TIARRAY:
    case RAVI_TFARRAY:
      mt = arrvalue(o)->metatable;
      break;
    case LUA_TTABLE:
      mt = hvalue(o)->metatable;
      break;
    case LUA_TUSERDATA:
      mt = uvalue(o)->metatable;
      break;
    default:
      mt = G(L)->mt[ttnov(o)];
  }
  return (mt ? luaH_getshortstr(mt, G(L)->tmname[event]) : luaO_nilobject);
}